

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_expression.hpp
# Opt level: O1

string * __thiscall
duckdb::CastExpression::ToString<duckdb::CastExpression,duckdb::ParsedExpression>
          (string *__return_storage_ptr__,CastExpression *this,CastExpression *entry)

{
  undefined8 *puVar1;
  long lVar2;
  pointer pPVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  char *pcVar11;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar11 = "CAST(";
  if (this->try_cast != false) {
    pcVar11 = "TRY_CAST(";
  }
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->child);
  (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(local_48);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,(ulong)pcVar11);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_58 = *plVar6;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar6;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_68);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_98 = *puVar7;
    lStack_90 = plVar4[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar7;
    local_a8 = (ulong *)*plVar4;
  }
  local_a0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  LogicalType::ToString_abi_cxx11_(&local_88,&this->cast_type);
  uVar9 = 0xf;
  if (local_a8 != &local_98) {
    uVar9 = local_98;
  }
  if (uVar9 < local_88._M_string_length + local_a0) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar10 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_a0 <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_01252125;
    }
  }
  puVar5 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
LAB_01252125:
  local_c8 = &local_b8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_b8 = *puVar1;
    uStack_b0 = puVar5[3];
  }
  else {
    local_b8 = *puVar1;
    local_c8 = (undefined8 *)*puVar5;
  }
  local_c0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		return (entry.try_cast ? "TRY_CAST(" : "CAST(") + entry.child->ToString() + " AS " +
		       entry.cast_type.ToString() + ")";
	}